

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

uint64_t anon_unknown.dwarf_3ea68::hashFile(string *filename)

{
  ulong uVar1;
  char *local_30;
  vector<char,_std::allocator<char>_> contents;
  
  uVar1 = 0;
  wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)&local_30,(BinaryOption)filename);
  for (; local_30 != _contents; local_30 = local_30 + 1) {
    uVar1 = uVar1 ^ (uVar1 >> 4) + uVar1 * 0x1000 + -0x61c8864680b583eb + (long)*local_30;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_30);
  return uVar1;
}

Assistant:

uint64_t hashFile(const std::string& filename) {
  auto contents(read_file<std::vector<char>>(filename, Flags::Binary));
  size_t digest = 0;
  // Don't use `hash` or `rehash` - they aren't deterministic between executions
  for (char c : contents) {
    hash_combine(digest, c);
  }
  return uint64_t(digest);
}